

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestCoverageCommand::InitializeHandler(cmCTestCoverageCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  cmCTestCoverageHandler *this_00;
  cmCTestCoverageHandler *handler;
  string local_68;
  allocator<char> local_31;
  string local_30;
  cmCTestCoverageCommand *local_10;
  cmCTestCoverageCommand *this_local;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CTEST_COVERAGE_COMMAND",&local_31);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CoverageCommand",&local_30,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CTEST_COVERAGE_EXTRA_FLAGS",
             (allocator<char> *)((long)&handler + 7));
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CoverageExtraFlags",&local_68,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
  this_00 = cmCTest::GetCoverageHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])();
  if ((this->LabelsMentioned & 1U) != 0) {
    cmCTestCoverageHandler::SetLabelFilter(this_00,&this->Labels);
  }
  cmCTestGenericHandler::SetQuiet
            (&this_00->super_cmCTestGenericHandler,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestCoverageCommand::InitializeHandler()
{
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageCommand", "CTEST_COVERAGE_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageExtraFlags", "CTEST_COVERAGE_EXTRA_FLAGS",
    this->Quiet);
  cmCTestCoverageHandler* handler = this->CTest->GetCoverageHandler();
  handler->Initialize();

  // If a LABELS option was given, select only files with the labels.
  if (this->LabelsMentioned) {
    handler->SetLabelFilter(this->Labels);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}